

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

LineInterpolationRange __thiscall
tcu::anon_unknown_3::calcLineInterpolationWeights
          (anon_unknown_3 *this,Vec2 *pa,float wa,Vec2 *pb,float wb,Vec2 *pr)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  LineInterpolationRange *returnValue;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar16;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar30;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Vec2 VVar17;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float res;
  undefined4 uVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined4 uVar48;
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined8 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar59;
  undefined1 auVar57 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  LineInterpolationRange LVar90;
  Vec2 VVar11;
  undefined1 auVar40 [16];
  undefined1 auVar46 [16];
  undefined1 auVar58 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  
  fVar60 = pb->m_data[0] - pa->m_data[0];
  fVar34 = pb->m_data[1] - pa->m_data[1];
  auVar26 = ZEXT816(0);
  bVar1 = true;
  fVar3 = pr->m_data[0] - pa->m_data[0];
  fVar35 = fVar60;
  do {
    bVar2 = bVar1;
    auVar26._0_4_ = auVar26._0_4_ + fVar35 * fVar3;
    bVar1 = false;
    fVar3 = pr->m_data[1] - pa->m_data[1];
    fVar35 = fVar34;
  } while (bVar2);
  if (ABS(auVar26._0_4_) == INFINITY) {
    auVar47._4_4_ = auVar26._0_4_;
    auVar47._0_4_ = auVar26._0_4_;
    auVar47._8_4_ = auVar26._0_4_;
    auVar47._12_4_ = auVar26._0_4_;
  }
  else {
    fVar35 = (float)((uint)auVar26._0_4_ & 0x7f800000);
    fVar3 = 1.1754944e-38;
    if (((uint)auVar26._0_4_ & 0x7fffff) == 0) {
      fVar3 = fVar35;
    }
    if (fVar35 != 0.0) {
      fVar3 = fVar35;
    }
    fVar3 = (float)((int)fVar3 + 0x2000) - fVar3;
    auVar47._0_4_ = auVar26._0_4_ - fVar3;
    auVar47._4_4_ = auVar26._0_4_ + fVar3;
    auVar47._8_8_ = 0;
  }
  auVar61._0_12_ = ZEXT812(0);
  auVar61._12_4_ = 0;
  fVar35 = fVar34 * fVar34 + fVar60 * fVar60 + 0.0;
  fVar3 = fVar35;
  if (ABS(fVar35) != INFINITY) {
    fVar3 = (float)((uint)fVar35 & 0x7f800000);
    fVar34 = 1.1754944e-38;
    if (((uint)fVar35 & 0x7fffff) == 0) {
      fVar34 = fVar3;
    }
    if (fVar3 != 0.0) {
      fVar34 = fVar3;
    }
    fVar3 = fVar35 + (fVar34 - (float)((uint)fVar34 | 0x2000));
    fVar35 = fVar35 + ((float)((uint)fVar34 | 0x2000) - fVar34);
  }
  bVar1 = auVar47._0_4_ != 0.0;
  bVar2 = auVar47._4_4_ != 0.0;
  auVar68._4_4_ = fVar35;
  auVar68._0_4_ = fVar35;
  auVar68._8_4_ = fVar35;
  auVar68._12_4_ = fVar35;
  if (bVar2 || bVar1) {
    if ((fVar35 < 0.0) || (0.0 < fVar3)) {
      auVar50._4_4_ = fVar3;
      auVar50._0_4_ = fVar3;
      auVar50._8_4_ = fVar3;
      auVar50._12_4_ = fVar3;
      auVar61 = divps(auVar47,auVar50);
      auVar26 = divps(auVar47,auVar68);
      uVar7 = -(uint)(auVar26._0_4_ <= auVar61._0_4_);
      uVar8 = -(uint)(auVar26._4_4_ <= auVar61._4_4_);
      uVar9 = -(uint)(auVar26._8_4_ <= auVar61._8_4_);
      uVar10 = -(uint)(auVar26._12_4_ <= auVar61._12_4_);
      fVar34 = (float)(~uVar7 & (uint)auVar26._0_4_ | (uint)auVar61._0_4_ & uVar7);
      auVar81._4_4_ = (float)(~uVar8 & (uint)auVar26._4_4_ | (uint)auVar61._4_4_ & uVar8);
      uVar7 = -(uint)(auVar81._4_4_ <= fVar34);
      auVar81._0_4_ = (uint)fVar34 & uVar7;
      auVar81._8_4_ =
           (~uVar9 & (uint)auVar26._8_4_ | (uint)auVar61._8_4_ & uVar9) & (uint)auVar81._4_4_;
      auVar81._12_4_ =
           (~uVar10 & (uint)auVar26._12_4_ | (uint)auVar61._12_4_ & uVar10) & (uint)auVar81._4_4_;
      auVar61 = ZEXT416(~uVar7 & (uint)auVar81._4_4_) | auVar81;
    }
    else {
      auVar61._0_12_ = ZEXT812(0x7f800000);
      auVar61._12_4_ = 0;
    }
  }
  uVar36 = auVar61._0_8_;
  fVar34 = auVar61._0_4_;
  if (ABS(fVar34) != INFINITY) {
    fVar60 = 1.1754944e-38;
    if ((auVar61 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar60 = (float)((uint)fVar34 & 0x7f800000);
    }
    if ((auVar61 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar60 = (float)((uint)fVar34 & 0x7f800000);
    }
    auVar51._4_12_ = auVar61._4_12_;
    auVar51._0_4_ = fVar34 + ((float)((int)fVar60 + 0x6000) - fVar60);
    uVar36 = auVar51._0_8_;
  }
  auVar63 = ZEXT816(0);
  if (bVar2 || bVar1) {
    if ((fVar35 < 0.0) || (0.0 < fVar3)) {
      auVar37._4_4_ = fVar3;
      auVar37._0_4_ = fVar3;
      auVar37._8_4_ = fVar3;
      auVar37._12_4_ = fVar3;
      auVar61 = divps(auVar47,auVar37);
      auVar26 = divps(auVar47,auVar68);
      uVar7 = -(uint)(auVar61._0_4_ <= auVar26._0_4_);
      uVar8 = -(uint)(auVar61._4_4_ <= auVar26._4_4_);
      uVar9 = -(uint)(auVar61._8_4_ <= auVar26._8_4_);
      uVar10 = -(uint)(auVar61._12_4_ <= auVar26._12_4_);
      fVar3 = (float)(~uVar7 & (uint)auVar26._0_4_ | (uint)auVar61._0_4_ & uVar7);
      auVar38._4_4_ = (float)(~uVar8 & (uint)auVar26._4_4_ | (uint)auVar61._4_4_ & uVar8);
      auVar38._8_4_ = ~uVar9 & (uint)auVar26._8_4_ | (uint)auVar61._8_4_ & uVar9;
      auVar38._12_4_ = ~uVar10 & (uint)auVar26._12_4_ | (uint)auVar61._12_4_ & uVar10;
      uVar7 = -(uint)(fVar3 <= auVar38._4_4_);
      auVar38._0_4_ = (uint)fVar3 & uVar7;
      auVar62._0_4_ = ~uVar7 & (uint)auVar38._4_4_;
      auVar62._4_4_ = 0;
      auVar62._8_4_ = ~auVar38._8_4_ & (uint)auVar38._4_4_;
      auVar62._12_4_ = ~auVar38._12_4_ & (uint)auVar38._4_4_;
      auVar63 = auVar62 | auVar38;
    }
    else {
      auVar63._0_12_ = ZEXT812(0xff800000);
      auVar63._12_4_ = 0;
    }
  }
  uVar16 = auVar63._0_8_;
  fVar3 = auVar63._0_4_;
  if (ABS(fVar3) != INFINITY) {
    fVar35 = 1.1754944e-38;
    if ((auVar63 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar35 = (float)((uint)fVar3 & 0x7f800000);
    }
    if ((auVar63 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar35 = (float)((uint)fVar3 & 0x7f800000);
    }
    auVar64._4_12_ = auVar63._4_12_;
    auVar64._0_4_ = fVar3 - ((float)((int)fVar35 + 0x6000) - fVar35);
    uVar16 = auVar64._0_8_;
  }
  auVar32._0_12_ = ZEXT812(0);
  auVar32._12_4_ = 0;
  fVar34 = (float)uVar16;
  fVar60 = (float)((ulong)uVar16 >> 0x20);
  fVar3 = (float)uVar36;
  fVar35 = (float)((ulong)uVar36 >> 0x20);
  if (fVar3 != 0.0 || fVar34 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      auVar40._8_4_ = fVar60;
      auVar40._0_8_ = uVar16;
      auVar40._12_4_ = fVar35;
      auVar39._8_8_ = auVar40._8_8_;
      auVar39._4_4_ = fVar3;
      auVar39._0_4_ = fVar34;
      auVar31._4_4_ = wb;
      auVar31._0_4_ = wb;
      auVar31._8_4_ = wb;
      auVar31._12_4_ = wb;
      auVar26 = divps(auVar39,auVar31);
      auVar41._4_4_ = auVar26._4_4_;
      uVar7 = -(uint)(auVar41._4_4_ <= auVar26._0_4_);
      auVar41._0_4_ = (uint)auVar26._0_4_ & uVar7;
      auVar41._8_4_ = auVar26._8_4_ & (uint)auVar41._4_4_;
      auVar41._12_4_ = auVar26._12_4_ & (uint)auVar41._4_4_;
      auVar32 = ZEXT416(~uVar7 & (uint)auVar41._4_4_) | auVar41;
    }
    else {
      auVar32._0_12_ = ZEXT812(0x7f800000);
      auVar32._12_4_ = 0;
    }
  }
  fVar4 = auVar32._0_4_;
  if (ABS(fVar4) != INFINITY) {
    fVar6 = 1.1754944e-38;
    if ((auVar32 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar6 = (float)((uint)fVar4 & 0x7f800000);
    }
    if ((auVar32 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar6 = (float)((uint)fVar4 & 0x7f800000);
    }
    auVar32._0_4_ = fVar4 + ((float)((int)fVar6 + 0x6000) - fVar6);
  }
  auVar43 = ZEXT816(0);
  if (fVar3 != 0.0 || fVar34 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      auVar70._8_4_ = fVar60;
      auVar70._0_8_ = uVar16;
      auVar70._12_4_ = fVar35;
      auVar69._8_8_ = auVar70._8_8_;
      auVar69._4_4_ = fVar3;
      auVar69._0_4_ = fVar34;
      auVar18._4_4_ = wb;
      auVar18._0_4_ = wb;
      auVar18._8_4_ = wb;
      auVar18._12_4_ = wb;
      auVar26 = divps(auVar69,auVar18);
      auVar71._4_4_ = auVar26._4_4_;
      auVar71._8_4_ = auVar26._8_4_;
      auVar71._12_4_ = auVar26._12_4_;
      uVar7 = -(uint)(auVar26._0_4_ <= auVar71._4_4_);
      auVar71._0_4_ = (uint)auVar26._0_4_ & uVar7;
      auVar42._0_4_ = ~uVar7 & (uint)auVar71._4_4_;
      auVar42._4_4_ = 0;
      auVar42._8_4_ = ~auVar71._8_4_ & (uint)auVar71._4_4_;
      auVar42._12_4_ = ~auVar71._12_4_ & (uint)auVar71._4_4_;
      auVar43 = auVar42 | auVar71;
    }
    else {
      auVar43._0_12_ = ZEXT812(0xff800000);
      auVar43._12_4_ = 0;
    }
  }
  uVar36 = auVar43._0_8_;
  fVar4 = auVar43._0_4_;
  if (ABS(fVar4) != INFINITY) {
    fVar6 = 1.1754944e-38;
    if ((auVar43 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar6 = (float)((uint)fVar4 & 0x7f800000);
    }
    if ((auVar43 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar6 = (float)((uint)fVar4 & 0x7f800000);
    }
    auVar44._4_12_ = auVar43._4_12_;
    auVar44._0_4_ = fVar4 - ((float)((int)fVar6 + 0x6000) - fVar6);
    uVar36 = auVar44._0_8_;
  }
  fVar3 = 1.0 - fVar3;
  fVar34 = 1.0 - fVar34;
  auVar65._0_8_ = CONCAT44(fVar34,fVar3);
  auVar65._8_4_ = 0.0 - fVar35;
  auVar65._12_4_ = 0.0 - fVar60;
  auVar20._0_12_ = ZEXT812(0);
  auVar20._12_4_ = 0;
  if (fVar34 != 0.0 || fVar3 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      auVar19._4_4_ = wa;
      auVar19._0_4_ = wa;
      auVar19._8_4_ = wa;
      auVar19._12_4_ = wa;
      auVar52._8_4_ = auVar65._8_4_;
      auVar52._0_8_ = auVar65._0_8_;
      auVar52._12_4_ = auVar65._12_4_;
      auVar26 = divps(auVar52,auVar19);
      auVar53._4_4_ = auVar26._4_4_;
      uVar7 = -(uint)(auVar53._4_4_ <= auVar26._0_4_);
      auVar53._0_4_ = (uint)auVar26._0_4_ & uVar7;
      auVar53._8_4_ = auVar26._8_4_ & (uint)auVar53._4_4_;
      auVar53._12_4_ = auVar26._12_4_ & (uint)auVar53._4_4_;
      auVar20 = ZEXT416(~uVar7 & (uint)auVar53._4_4_) | auVar53;
    }
    else {
      auVar20._0_12_ = ZEXT812(0x7f800000);
      auVar20._12_4_ = 0;
    }
  }
  uVar16 = auVar20._0_8_;
  fVar35 = auVar20._0_4_;
  if (ABS(fVar35) != INFINITY) {
    fVar60 = 1.1754944e-38;
    if ((auVar20 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar60 = (float)((uint)fVar35 & 0x7f800000);
    }
    if ((auVar20 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar60 = (float)((uint)fVar35 & 0x7f800000);
    }
    auVar21._4_12_ = auVar20._4_12_;
    auVar21._0_4_ = fVar35 + ((float)((int)fVar60 + 0x6000) - fVar60);
    uVar16 = auVar21._0_8_;
  }
  auVar55 = ZEXT816(0);
  if (fVar34 != 0.0 || fVar3 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      auVar12._4_4_ = wa;
      auVar12._0_4_ = wa;
      auVar12._8_4_ = wa;
      auVar12._12_4_ = wa;
      auVar26 = divps(auVar65,auVar12);
      auVar66._4_4_ = auVar26._4_4_;
      auVar66._8_4_ = auVar26._8_4_;
      auVar66._12_4_ = auVar26._12_4_;
      uVar7 = -(uint)(auVar26._0_4_ <= auVar66._4_4_);
      auVar66._0_4_ = (uint)auVar26._0_4_ & uVar7;
      auVar54._0_4_ = ~uVar7 & (uint)auVar66._4_4_;
      auVar54._4_4_ = 0;
      auVar54._8_4_ = ~auVar66._8_4_ & (uint)auVar66._4_4_;
      auVar54._12_4_ = ~auVar66._12_4_ & (uint)auVar66._4_4_;
      auVar55 = auVar54 | auVar66;
    }
    else {
      auVar55._0_12_ = ZEXT812(0xff800000);
      auVar55._12_4_ = 0;
    }
  }
  uVar49 = auVar55._0_8_;
  fVar3 = auVar55._0_4_;
  if (ABS(fVar3) != INFINITY) {
    fVar35 = 1.1754944e-38;
    if ((auVar55 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar35 = (float)((uint)fVar3 & 0x7f800000);
    }
    if ((auVar55 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar35 = (float)((uint)fVar3 & 0x7f800000);
    }
    auVar56._4_12_ = auVar55._4_12_;
    auVar56._0_4_ = fVar3 - ((float)((int)fVar35 + 0x6000) - fVar35);
    uVar49 = auVar56._0_8_;
  }
  fVar34 = auVar32._0_4_;
  uVar33 = auVar32._4_4_;
  auVar13._4_12_ = auVar32._4_12_;
  fVar35 = (float)uVar16;
  fVar3 = fVar34 + fVar35;
  if (ABS(fVar3) != INFINITY) {
    fVar4 = (float)((uint)fVar3 & 0x7f800000);
    fVar60 = 1.1754944e-38;
    if (((uint)fVar3 & 0x7fffff) == 0) {
      fVar60 = fVar4;
    }
    if (fVar4 != 0.0) {
      fVar60 = fVar4;
    }
    fVar3 = fVar3 + ((float)((int)fVar60 + 0x2000) - fVar60);
  }
  auVar13._0_4_ = fVar3;
  VVar11.m_data = auVar13._0_8_;
  fVar60 = (float)uVar36;
  uVar48 = (undefined4)((ulong)uVar36 >> 0x20);
  auVar57._0_4_ = (float)uVar49;
  fVar4 = fVar60 + auVar57._0_4_;
  if (ABS(fVar4) != INFINITY) {
    fVar5 = (float)((uint)fVar4 & 0x7f800000);
    fVar6 = 1.1754944e-38;
    if (((uint)fVar4 & 0x7fffff) == 0) {
      fVar6 = fVar5;
    }
    if (fVar5 != 0.0) {
      fVar6 = fVar5;
    }
    fVar4 = fVar4 - ((float)((int)fVar6 + 0x2000) - fVar6);
  }
  auVar74._0_12_ = ZEXT812(0);
  auVar74._12_4_ = 0;
  uVar59 = (undefined4)((ulong)uVar49 >> 0x20);
  uVar30 = (undefined4)((ulong)uVar16 >> 0x20);
  if (fVar35 != 0.0 || auVar57._0_4_ != 0.0) {
    if ((fVar3 < 0.0) || (0.0 < fVar4)) {
      auVar73._8_4_ = uVar59;
      auVar73._0_8_ = uVar49;
      auVar73._12_4_ = uVar30;
      auVar72._8_8_ = auVar73._8_8_;
      auVar72._4_4_ = fVar35;
      auVar72._0_4_ = auVar57._0_4_;
      auVar82._4_4_ = fVar4;
      auVar82._0_4_ = fVar4;
      auVar82._8_4_ = fVar4;
      auVar82._12_4_ = fVar4;
      auVar88._4_4_ = fVar35;
      auVar88._0_4_ = auVar57._0_4_;
      auVar88._8_4_ = uVar59;
      auVar88._12_4_ = uVar30;
      auVar47 = divps(auVar88,auVar82);
      auVar83._4_4_ = fVar3;
      auVar83._0_4_ = fVar3;
      auVar83._8_4_ = fVar3;
      auVar83._12_4_ = fVar3;
      auVar26 = divps(auVar72,auVar83);
      uVar7 = -(uint)(auVar26._0_4_ <= auVar47._0_4_);
      uVar8 = -(uint)(auVar26._4_4_ <= auVar47._4_4_);
      uVar9 = -(uint)(auVar26._8_4_ <= auVar47._8_4_);
      uVar10 = -(uint)(auVar26._12_4_ <= auVar47._12_4_);
      fVar6 = (float)(~uVar7 & (uint)auVar26._0_4_ | (uint)auVar47._0_4_ & uVar7);
      auVar84._4_4_ = (float)(~uVar8 & (uint)auVar26._4_4_ | (uint)auVar47._4_4_ & uVar8);
      uVar7 = -(uint)(auVar84._4_4_ <= fVar6);
      auVar84._0_4_ = (uint)fVar6 & uVar7;
      auVar84._8_4_ =
           (~uVar9 & (uint)auVar26._8_4_ | (uint)auVar47._8_4_ & uVar9) & (uint)auVar84._4_4_;
      auVar84._12_4_ =
           (~uVar10 & (uint)auVar26._12_4_ | (uint)auVar47._12_4_ & uVar10) & (uint)auVar84._4_4_;
      auVar74 = ZEXT416(~uVar7 & (uint)auVar84._4_4_) | auVar84;
    }
    else {
      auVar74._0_12_ = ZEXT812(0x7f800000);
      auVar74._12_4_ = 0;
    }
  }
  fVar6 = auVar74._0_4_;
  if (ABS(fVar6) != INFINITY) {
    fVar5 = 1.1754944e-38;
    if ((auVar74 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar6 & 0x7f800000);
    }
    if ((auVar74 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar6 & 0x7f800000);
    }
    auVar74._0_4_ = fVar6 + ((float)((int)fVar5 + 0x6000) - fVar5);
  }
  *(int *)this = auVar74._0_4_;
  auVar77._0_12_ = ZEXT812(0);
  auVar77._12_4_ = 0;
  if (fVar60 != 0.0 || fVar34 != 0.0) {
    if ((fVar3 < 0.0) || (0.0 < fVar4)) {
      auVar76._8_4_ = uVar48;
      auVar76._0_8_ = uVar36;
      auVar76._12_4_ = uVar33;
      auVar75._8_8_ = auVar76._8_8_;
      auVar75._4_4_ = fVar34;
      auVar75._0_4_ = fVar60;
      auVar85._4_4_ = fVar4;
      auVar85._0_4_ = fVar4;
      auVar85._8_4_ = fVar4;
      auVar85._12_4_ = fVar4;
      auVar89._4_4_ = fVar34;
      auVar89._0_4_ = fVar60;
      auVar89._8_4_ = uVar48;
      auVar89._12_4_ = uVar33;
      auVar47 = divps(auVar89,auVar85);
      auVar86._4_4_ = fVar3;
      auVar86._0_4_ = fVar3;
      auVar86._8_4_ = fVar3;
      auVar86._12_4_ = fVar3;
      auVar26 = divps(auVar75,auVar86);
      uVar7 = -(uint)(auVar26._0_4_ <= auVar47._0_4_);
      uVar8 = -(uint)(auVar26._4_4_ <= auVar47._4_4_);
      uVar9 = -(uint)(auVar26._8_4_ <= auVar47._8_4_);
      uVar10 = -(uint)(auVar26._12_4_ <= auVar47._12_4_);
      fVar6 = (float)(~uVar7 & (uint)auVar26._0_4_ | (uint)auVar47._0_4_ & uVar7);
      auVar87._4_4_ = (float)(~uVar8 & (uint)auVar26._4_4_ | (uint)auVar47._4_4_ & uVar8);
      uVar7 = -(uint)(auVar87._4_4_ <= fVar6);
      auVar87._0_4_ = (uint)fVar6 & uVar7;
      auVar87._8_4_ =
           (~uVar9 & (uint)auVar26._8_4_ | (uint)auVar47._8_4_ & uVar9) & (uint)auVar87._4_4_;
      auVar87._12_4_ =
           (~uVar10 & (uint)auVar26._12_4_ | (uint)auVar47._12_4_ & uVar10) & (uint)auVar87._4_4_;
      auVar77 = ZEXT416(~uVar7 & (uint)auVar87._4_4_) | auVar87;
    }
    else {
      auVar77._0_12_ = ZEXT812(0x7f800000);
      auVar77._12_4_ = 0;
    }
  }
  fVar6 = auVar77._0_4_;
  if (ABS(fVar6) != INFINITY) {
    fVar5 = 1.1754944e-38;
    if ((auVar77 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar6 & 0x7f800000);
    }
    if ((auVar77 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar6 & 0x7f800000);
    }
    auVar77._0_4_ = fVar6 + ((float)((int)fVar5 + 0x6000) - fVar5);
  }
  *(int *)(this + 4) = auVar77._0_4_;
  auVar80 = ZEXT816(0);
  if (fVar35 != 0.0 || auVar57._0_4_ != 0.0) {
    if ((fVar3 < 0.0) || (0.0 < fVar4)) {
      auVar58._8_4_ = uVar59;
      auVar58._0_8_ = uVar49;
      auVar58._12_4_ = uVar30;
      auVar57._8_8_ = auVar58._8_8_;
      auVar57._4_4_ = fVar35;
      auVar22._4_4_ = fVar4;
      auVar22._0_4_ = fVar4;
      auVar22._8_4_ = fVar4;
      auVar22._12_4_ = fVar4;
      auVar78._4_4_ = fVar35;
      auVar78._0_4_ = auVar57._0_4_;
      auVar78._8_4_ = uVar59;
      auVar78._12_4_ = uVar30;
      auVar47 = divps(auVar78,auVar22);
      auVar23._4_4_ = fVar3;
      auVar23._0_4_ = fVar3;
      auVar23._8_4_ = fVar3;
      auVar23._12_4_ = fVar3;
      auVar26 = divps(auVar57,auVar23);
      uVar7 = -(uint)(auVar47._0_4_ <= auVar26._0_4_);
      uVar8 = -(uint)(auVar47._4_4_ <= auVar26._4_4_);
      uVar9 = -(uint)(auVar47._8_4_ <= auVar26._8_4_);
      uVar10 = -(uint)(auVar47._12_4_ <= auVar26._12_4_);
      fVar35 = (float)(~uVar7 & (uint)auVar26._0_4_ | (uint)auVar47._0_4_ & uVar7);
      auVar24._4_4_ = (float)(~uVar8 & (uint)auVar26._4_4_ | (uint)auVar47._4_4_ & uVar8);
      auVar24._8_4_ = ~uVar9 & (uint)auVar26._8_4_ | (uint)auVar47._8_4_ & uVar9;
      auVar24._12_4_ = ~uVar10 & (uint)auVar26._12_4_ | (uint)auVar47._12_4_ & uVar10;
      uVar7 = -(uint)(fVar35 <= auVar24._4_4_);
      auVar24._0_4_ = (uint)fVar35 & uVar7;
      auVar79._0_4_ = ~uVar7 & (uint)auVar24._4_4_;
      auVar79._4_4_ = 0;
      auVar79._8_4_ = ~auVar24._8_4_ & (uint)auVar24._4_4_;
      auVar79._12_4_ = ~auVar24._12_4_ & (uint)auVar24._4_4_;
      auVar80 = auVar79 | auVar24;
    }
    else {
      auVar80._0_12_ = ZEXT812(0xff800000);
      auVar80._12_4_ = 0;
    }
  }
  fVar35 = auVar80._0_4_;
  if (ABS(fVar35) != INFINITY) {
    fVar6 = 1.1754944e-38;
    if ((auVar80 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar6 = (float)((uint)fVar35 & 0x7f800000);
    }
    if ((auVar80 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar6 = (float)((uint)fVar35 & 0x7f800000);
    }
    auVar80._0_4_ = fVar35 - ((float)((int)fVar6 + 0x6000) - fVar6);
  }
  *(int *)(this + 8) = auVar80._0_4_;
  auVar28 = ZEXT816(0);
  if (fVar60 != 0.0 || fVar34 != 0.0) {
    if ((fVar3 < 0.0) || (0.0 < fVar4)) {
      auVar46._8_4_ = uVar48;
      auVar46._0_8_ = uVar36;
      auVar46._12_4_ = uVar33;
      auVar45._8_8_ = auVar46._8_8_;
      auVar45._0_8_ = CONCAT44(fVar34,fVar60);
      auVar67._4_4_ = fVar4;
      auVar67._0_4_ = fVar4;
      auVar67._8_4_ = fVar4;
      auVar67._12_4_ = fVar4;
      auVar25._8_4_ = uVar48;
      auVar25._0_8_ = auVar45._0_8_;
      auVar25._12_4_ = uVar33;
      auVar26 = divps(auVar25,auVar67);
      auVar14._4_4_ = fVar3;
      auVar14._0_4_ = fVar3;
      auVar14._8_4_ = fVar3;
      auVar14._12_4_ = fVar3;
      auVar47 = divps(auVar45,auVar14);
      uVar7 = -(uint)(auVar26._0_4_ <= auVar47._0_4_);
      uVar8 = -(uint)(auVar26._4_4_ <= auVar47._4_4_);
      uVar9 = -(uint)(auVar26._8_4_ <= auVar47._8_4_);
      uVar10 = -(uint)(auVar26._12_4_ <= auVar47._12_4_);
      fVar3 = (float)(~uVar7 & (uint)auVar47._0_4_ | (uint)auVar26._0_4_ & uVar7);
      VVar11.m_data[1] = (float)(~uVar8 & (uint)auVar47._4_4_ | (uint)auVar26._4_4_ & uVar8);
      auVar15._8_4_ = ~uVar9 & (uint)auVar47._8_4_ | (uint)auVar26._8_4_ & uVar9;
      auVar15._12_4_ = ~uVar10 & (uint)auVar47._12_4_ | (uint)auVar26._12_4_ & uVar10;
      uVar7 = -(uint)(fVar3 <= VVar11.m_data[1]);
      VVar11.m_data[0] = (float)((uint)fVar3 & uVar7);
      auVar15._0_4_ = VVar11.m_data[0];
      auVar15._4_4_ = VVar11.m_data[1];
      auVar27._0_4_ = ~uVar7 & (uint)VVar11.m_data[1];
      auVar27._4_4_ = 0;
      auVar27._8_4_ = ~auVar15._8_4_ & (uint)VVar11.m_data[1];
      auVar27._12_4_ = ~auVar15._12_4_ & (uint)VVar11.m_data[1];
      auVar28 = auVar27 | auVar15;
    }
    else {
      auVar28._0_12_ = ZEXT812(0xff800000);
      auVar28._12_4_ = 0;
    }
  }
  VVar17.m_data = auVar28._0_8_;
  fVar3 = auVar28._0_4_;
  if (ABS(fVar3) != INFINITY) {
    fVar35 = 1.1754944e-38;
    if ((auVar28 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar35 = (float)((uint)fVar3 & 0x7f800000);
    }
    if ((auVar28 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar35 = (float)((uint)fVar3 & 0x7f800000);
    }
    VVar11.m_data[0] = (float)((int)fVar35 + 0x6000) - fVar35;
    VVar11.m_data[1] = 0.0;
    auVar29._4_12_ = auVar28._4_12_;
    auVar29._0_4_ = fVar3 - VVar11.m_data[0];
    VVar17.m_data = auVar29._0_8_;
  }
  *(float *)(this + 0xc) = VVar17.m_data[0];
  LVar90.min.m_data[0] = VVar17.m_data[0];
  LVar90.min.m_data[1] = VVar17.m_data[1];
  LVar90.max.m_data[0] = VVar11.m_data[0];
  LVar90.max.m_data[1] = VVar11.m_data[1];
  return LVar90;
}

Assistant:

LineInterpolationRange calcLineInterpolationWeights (const tcu::Vec2& pa, float wa, const tcu::Vec2& pb, float wb, const tcu::Vec2& pr)
{
	const int roundError	= 1;
	const int divError		= 3;

	// calc weights:
	//			(1-t) / wa					t / wb
	//		-------------------	,	-------------------
	//		(1-t) / wa + t / wb		(1-t) / wa + t / wb

	// Allow 1 ULP
	const float		dividend	= tcu::dot(pr - pa, pb - pa);
	const float		dividendMax	= getMaxValueWithinError(dividend, 1);
	const float		dividendMin	= getMinValueWithinError(dividend, 1);
	DE_ASSERT(dividendMin <= dividendMax);

	// Assuming lengthSquared will not be implemented as sqrt(x)^2, allow 1 ULP
	const float		divisor		= tcu::lengthSquared(pb - pa);
	const float		divisorMax	= getMaxValueWithinError(divisor, 1);
	const float		divisorMin	= getMinValueWithinError(divisor, 1);
	DE_ASSERT(divisorMin <= divisorMax);

	// Allow 3 ULP precision for division
	const float		tMax		= getMaxValueWithinError(maximalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	const float		tMin		= getMinValueWithinError(minimalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	DE_ASSERT(tMin <= tMax);

	const float		perspectiveTMax			= getMaxValueWithinError(maximalRangeDivision(tMin, tMax, wb, wb), divError);
	const float		perspectiveTMin			= getMinValueWithinError(minimalRangeDivision(tMin, tMax, wb, wb), divError);
	DE_ASSERT(perspectiveTMin <= perspectiveTMax);

	const float		perspectiveInvTMax		= getMaxValueWithinError(maximalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	const float		perspectiveInvTMin		= getMinValueWithinError(minimalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	DE_ASSERT(perspectiveInvTMin <= perspectiveInvTMax);

	const float		perspectiveDivisorMax	= getMaxValueWithinError(perspectiveTMax + perspectiveInvTMax, roundError);
	const float		perspectiveDivisorMin	= getMinValueWithinError(perspectiveTMin + perspectiveInvTMin, roundError);
	DE_ASSERT(perspectiveDivisorMin <= perspectiveDivisorMax);

	LineInterpolationRange returnValue;
	returnValue.max.x() = getMaxValueWithinError(maximalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.max.y() = getMaxValueWithinError(maximalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.x() = getMinValueWithinError(minimalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.y() = getMinValueWithinError(minimalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());

	return returnValue;
}